

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_affixes.cpp
# Opt level: O0

void __thiscall
icu_63::numparse::impl::AffixPatternMatcherBuilder::addMatcher
          (AffixPatternMatcherBuilder *this,NumberParseMatcher *matcher)

{
  int iVar1;
  int32_t iVar2;
  NumberParseMatcher **ppNVar3;
  NumberParseMatcher *matcher_local;
  AffixPatternMatcherBuilder *this_local;
  
  iVar1 = this->fMatchersLen;
  iVar2 = MaybeStackArray<const_icu_63::numparse::impl::NumberParseMatcher_*,_3>::getCapacity
                    (&this->fMatchers);
  if (iVar2 <= iVar1) {
    MaybeStackArray<const_icu_63::numparse::impl::NumberParseMatcher_*,_3>::resize
              (&this->fMatchers,this->fMatchersLen << 1,this->fMatchersLen);
  }
  iVar1 = this->fMatchersLen;
  this->fMatchersLen = iVar1 + 1;
  ppNVar3 = MaybeStackArray<const_icu_63::numparse::impl::NumberParseMatcher_*,_3>::operator[]
                      (&this->fMatchers,(long)iVar1);
  *ppNVar3 = matcher;
  return;
}

Assistant:

void AffixPatternMatcherBuilder::addMatcher(NumberParseMatcher& matcher) {
    if (fMatchersLen >= fMatchers.getCapacity()) {
        fMatchers.resize(fMatchersLen * 2, fMatchersLen);
    }
    fMatchers[fMatchersLen++] = &matcher;
}